

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O0

_binbuf * pointertobinbuf(t_pd *x,t_gpointer *gp,t_symbol *s,char *fname)

{
  _symbol *p_Var1;
  int iVar2;
  char *local_68;
  t_word *vec;
  t_gstub *gs;
  _binbuf *b;
  int type;
  int onset;
  t_template *template;
  t_symbol *arraytype;
  t_symbol *templatesym;
  char *fname_local;
  t_symbol *s_local;
  t_gpointer *gp_local;
  t_pd *x_local;
  
  templatesym = (t_symbol *)fname;
  fname_local = (char *)s;
  s_local = (t_symbol *)gp;
  gp_local = (t_gpointer *)x;
  arraytype = gpointer_gettemplatesym(gp);
  p_Var1 = s_local->s_next;
  if (arraytype == (t_symbol *)0x0) {
    pd_error(gp_local,"%s: bad pointer",templatesym);
    x_local = (t_pd *)0x0;
  }
  else {
    _type = template_findbyname(arraytype);
    if (_type == (t_template *)0x0) {
      pd_error(gp_local,"%s: couldn\'t find template %s",templatesym,arraytype->s_name);
      x_local = (t_pd *)0x0;
    }
    else {
      iVar2 = template_find_field(_type,(t_symbol *)fname_local,(int *)((long)&b + 4),(int *)&b,
                                  (t_symbol **)&template);
      if (iVar2 == 0) {
        pd_error(gp_local,"%s: %s.%s: no such field",templatesym,arraytype->s_name,
                 *(undefined8 *)fname_local);
        x_local = (t_pd *)0x0;
      }
      else if ((int)b == 2) {
        if (*(int *)&p_Var1->s_thing == 2) {
          local_68 = s_local->s_name;
        }
        else {
          local_68 = s_local->s_name + 0x18;
        }
        x_local = *(t_pd **)(local_68 + (long)b._4_4_ * 8);
      }
      else {
        pd_error(gp_local,"%s: %s.%s: not a list",templatesym,arraytype->s_name,
                 *(undefined8 *)fname_local);
        x_local = (t_pd *)0x0;
      }
    }
  }
  return (_binbuf *)x_local;
}

Assistant:

t_binbuf *pointertobinbuf(t_pd *x, t_gpointer *gp, t_symbol *s,
    const char *fname)
{
    t_symbol *templatesym = gpointer_gettemplatesym(gp), *arraytype;
    t_template *template;
    int onset, type;
    t_binbuf *b;
    t_gstub *gs = gp->gp_stub;
    t_word *vec;
    if (!templatesym)
    {
        pd_error(x, "%s: bad pointer", fname);
        return (0);
    }
    if (!(template = template_findbyname(templatesym)))
    {
        pd_error(x, "%s: couldn't find template %s", fname,
            templatesym->s_name);
        return (0);
    }
    if (!template_find_field(template, s, &onset, &type, &arraytype))
    {
        pd_error(x, "%s: %s.%s: no such field", fname,
            templatesym->s_name, s->s_name);
        return (0);
    }
    if (type != DT_TEXT)
    {
        pd_error(x, "%s: %s.%s: not a list", fname,
            templatesym->s_name, s->s_name);
        return (0);
    }
    if (gs->gs_which == GP_ARRAY)
        vec = gp->gp_un.gp_w;
    else vec = gp->gp_un.gp_scalar->sc_vec;
    return (vec[onset].w_binbuf);
}